

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

sFace * __thiscall gjkepa2_impl::EPA::newface(EPA *this,sSV *a,sSV *b,sSV *c,bool forced)

{
  cbtScalar *dist;
  U *pUVar1;
  float fVar2;
  float fVar3;
  sFace *face;
  sFace *psVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  _ _Var9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  face = (this->m_stock).root;
  if (face == (sFace *)0x0) {
    this->m_status = OutOfFaces;
  }
  else {
    if (face->l[1] != (sFace *)0x0) {
      face->l[1]->l[0] = face->l[0];
    }
    if (face->l[0] != (sFace *)0x0) {
      face->l[0]->l[1] = face->l[1];
    }
    if ((this->m_stock).root == face) {
      (this->m_stock).root = face->l[1];
    }
    pUVar1 = &(this->m_stock).count;
    *pUVar1 = *pUVar1 - 1;
    face->l[0] = (sFace *)0x0;
    face->l[1] = (this->m_hull).root;
    psVar4 = (this->m_hull).root;
    if (psVar4 != (sFace *)0x0) {
      psVar4->l[0] = face;
    }
    (this->m_hull).root = face;
    pUVar1 = &(this->m_hull).count;
    *pUVar1 = *pUVar1 + 1;
    face->pass = '\0';
    face->c[0] = a;
    face->c[1] = b;
    face->c[2] = c;
    fVar10 = (a->w).m_floats[0];
    fVar2 = (a->w).m_floats[1];
    fVar5 = (b->w).m_floats[0] - fVar10;
    fVar6 = (b->w).m_floats[1] - fVar2;
    fVar3 = (a->w).m_floats[2];
    fVar7 = (b->w).m_floats[2] - fVar3;
    fVar10 = (c->w).m_floats[0] - fVar10;
    fVar2 = (c->w).m_floats[1] - fVar2;
    fVar3 = (c->w).m_floats[2] - fVar3;
    auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar7)),ZEXT416((uint)fVar6),
                              ZEXT416((uint)fVar3));
    auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar5)),ZEXT416((uint)fVar10),
                              ZEXT416((uint)fVar7));
    auVar11 = vinsertps_avx(auVar11,auVar12,0x10);
    auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar6)),ZEXT416((uint)fVar5),
                              ZEXT416((uint)fVar2));
    auVar11 = vinsertps_avx(auVar11,auVar12,0x28);
    *(undefined1 (*) [16])(face->n).m_floats = auVar11;
    fVar10 = (face->n).m_floats[1];
    auVar11 = ZEXT416((uint)(face->n).m_floats[0]);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar11,auVar11);
    auVar12 = ZEXT416((uint)(face->n).m_floats[2]);
    auVar11 = vfmadd213ss_fma(auVar12,auVar12,auVar11);
    if (auVar11._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar10 = auVar11._0_4_;
    }
    _Var9 = Degenerated;
    if (0.0001 < fVar10) {
      dist = &face->d;
      bVar8 = getedgedist(this,face,a,b,dist);
      if (((!bVar8) && (bVar8 = getedgedist(this,face,b,c,dist), !bVar8)) &&
         (bVar8 = getedgedist(this,face,c,a,dist), !bVar8)) {
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)((a->w).m_floats[1] * (face->n).m_floats[1])),
                                  ZEXT416((uint)(a->w).m_floats[0]),
                                  ZEXT416((uint)(face->n).m_floats[0]));
        auVar11 = vfmadd132ss_fma(ZEXT416((uint)(a->w).m_floats[2]),auVar11,
                                  ZEXT416((uint)(face->n).m_floats[2]));
        face->d = auVar11._0_4_ / fVar10;
      }
      fVar10 = 1.0 / fVar10;
      (face->n).m_floats[0] = fVar10 * (face->n).m_floats[0];
      (face->n).m_floats[1] = fVar10 * (face->n).m_floats[1];
      (face->n).m_floats[2] = fVar10 * (face->n).m_floats[2];
      if (forced) {
        return face;
      }
      _Var9 = NonConvex;
      if (-1e-05 <= *dist) {
        return face;
      }
    }
    this->m_status = _Var9;
    if (face->l[1] != (sFace *)0x0) {
      face->l[1]->l[0] = face->l[0];
    }
    if (face->l[0] != (sFace *)0x0) {
      face->l[0]->l[1] = face->l[1];
    }
    if ((this->m_hull).root == face) {
      (this->m_hull).root = face->l[1];
    }
    pUVar1 = &(this->m_hull).count;
    *pUVar1 = *pUVar1 - 1;
    face->l[0] = (sFace *)0x0;
    face->l[1] = (this->m_stock).root;
    psVar4 = (this->m_stock).root;
    if (psVar4 != (sFace *)0x0) {
      psVar4->l[0] = face;
    }
    (this->m_stock).root = face;
    pUVar1 = &(this->m_stock).count;
    *pUVar1 = *pUVar1 + 1;
  }
  return (sFace *)0x0;
}

Assistant:

sFace* newface(sSV* a, sSV* b, sSV* c, bool forced)
	{
		if (m_stock.root)
		{
			sFace* face = m_stock.root;
			remove(m_stock, face);
			append(m_hull, face);
			face->pass = 0;
			face->c[0] = a;
			face->c[1] = b;
			face->c[2] = c;
			face->n = cbtCross(b->w - a->w, c->w - a->w);
			const cbtScalar l = face->n.length();
			const bool v = l > EPA_ACCURACY;

			if (v)
			{
				if (!(getedgedist(face, a, b, face->d) ||
					  getedgedist(face, b, c, face->d) ||
					  getedgedist(face, c, a, face->d)))
				{
					// Origin projects to the interior of the triangle
					// Use distance to triangle plane
					face->d = cbtDot(a->w, face->n) / l;
				}

				face->n /= l;
				if (forced || (face->d >= -EPA_PLANE_EPS))
				{
					return face;
				}
				else
					m_status = eStatus::NonConvex;
			}
			else
				m_status = eStatus::Degenerated;

			remove(m_hull, face);
			append(m_stock, face);
			return 0;
		}
		m_status = m_stock.root ? eStatus::OutOfVertices : eStatus::OutOfFaces;
		return 0;
	}